

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O3

MPP_RET vepu541_set_roi(void *buf,MppEncROICfg *roi,RK_S32 w,RK_S32 h)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *fmt;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  RK_U8 *pRVar9;
  MppEncROIRegion *pMVar10;
  
  uVar8 = (ulong)(uint)h;
  if (roi == (MppEncROICfg *)0x0 || buf == (void *)0x0) {
    _mpp_log_l(2,"vepu541_common","invalid buf %p roi %p\n","vepu541_set_roi",buf,roi);
  }
  else {
    uVar6 = (ulong)(uint)w;
    pMVar10 = roi->regions;
    uVar2 = ((w + 0xf >> 4) + 3U & 0xfffffffc) * ((h + 0xf >> 4) + 3U & 0x3ffffffc);
    if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        puVar1 = (undefined8 *)((long)buf + uVar5 * 2);
        *puVar1 = 0x80008000800080;
        puVar1[1] = 0x80008000800080;
        uVar5 = uVar5 + 8;
      } while (uVar2 != uVar5);
    }
    if (w < 1 || h < 1) {
      fmt = "invalid size [%d:%d]\n";
LAB_00262cb2:
      _mpp_log_l(2,"vepu541_common",fmt,"vepu541_set_roi",uVar6,uVar8);
    }
    else {
      uVar2 = roi->number;
      if (uVar2 < 9) {
        if (uVar2 == 0) {
          return MPP_OK;
        }
        pRVar9 = &pMVar10->abs_qp_en;
        uVar3 = 0;
        do {
          if ((w < (int)((uint)*(ushort *)(pRVar9 + -0xb) +
                        (uint)((MppEncROIRegion *)(pRVar9 + -0xf))->x)) ||
             (iVar4 = 0,
             h < (int)((uint)*(ushort *)(pRVar9 + -9) + (uint)*(ushort *)(pRVar9 + -0xd)))) {
            iVar4 = -1;
          }
          if ((((1 < *(ushort *)(pRVar9 + -7)) || (7 < *(ushort *)(pRVar9 + -3))) ||
              (1 < pRVar9[-1])) || (bVar7 = *pRVar9, 1 < bVar7)) {
            bVar7 = *pRVar9;
            iVar4 = -1;
          }
          if (bVar7 == 0) {
            if ((iVar4 != 0) || (0x66 < (ushort)(*(short *)(pRVar9 + -5) + 0x33U))) {
LAB_00262dc3:
              _mpp_log_l(2,"vepu541_common","region %d invalid param:\n","vepu541_set_roi",
                         (ulong)uVar3);
              _mpp_log_l(2,"vepu541_common","position [%d:%d:%d:%d] vs [%d:%d]\n","vepu541_set_roi",
                         (ulong)((MppEncROIRegion *)(pRVar9 + -0xf))->x,
                         (ulong)*(ushort *)(pRVar9 + -0xd),(ulong)*(ushort *)(pRVar9 + -0xb),
                         (ulong)*(ushort *)(pRVar9 + -9),uVar6,uVar8);
              _mpp_log_l(2,"vepu541_common","force intra %d qp area index %d\n","vepu541_set_roi",
                         (ulong)*(ushort *)(pRVar9 + -7),(ulong)*(ushort *)(pRVar9 + -3));
              uVar6 = (ulong)*pRVar9;
              uVar8 = (ulong)(uint)(int)*(short *)(pRVar9 + -5);
              fmt = "abs qp mode %d value %d\n";
              goto LAB_00262cb2;
            }
          }
          else if ((iVar4 != 0) || (0x33 < *(short *)(pRVar9 + -5))) goto LAB_00262dc3;
          uVar3 = uVar3 + 1;
          pRVar9 = pRVar9 + 0x10;
          if (uVar2 == uVar3) {
            pMVar10 = roi->regions;
            iVar4 = 0;
            do {
              vepu541_set_one_roi(buf,pMVar10,w,h);
              iVar4 = iVar4 + 1;
              pMVar10 = pMVar10 + 1;
            } while (iVar4 < (int)roi->number);
            return MPP_OK;
          }
        } while( true );
      }
      _mpp_log_l(2,"vepu541_common","invalid region number %d\n","vepu541_set_roi");
    }
  }
  return MPP_NOK;
}

Assistant:

MPP_RET vepu541_set_roi(void *buf, MppEncROICfg *roi, RK_S32 w, RK_S32 h)
{
    MppEncROIRegion *region = roi->regions;
    Vepu541RoiCfg *ptr = (Vepu541RoiCfg *)buf;
    RK_S32 mb_w = MPP_ALIGN(w, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(h, 16) / 16;
    RK_S32 stride_h = MPP_ALIGN(mb_w, 4);
    RK_S32 stride_v = MPP_ALIGN(mb_h, 4);
    Vepu541RoiCfg cfg;
    MPP_RET ret = MPP_NOK;
    RK_S32 i;

    if (NULL == buf || NULL == roi) {
        mpp_err_f("invalid buf %p roi %p\n", buf, roi);
        goto DONE;
    }

    cfg.force_intra = 0;
    cfg.reserved    = 0;
    cfg.qp_area_idx = 0;
    cfg.qp_area_en  = 1;
    cfg.qp_adj      = 0;
    cfg.qp_adj_mode = 0;

    /* step 1. reset all the config */
    for (i = 0; i < stride_h * stride_v; i++, ptr++)
        memcpy(ptr, &cfg, sizeof(cfg));

    if (w <= 0 || h <= 0) {
        mpp_err_f("invalid size [%d:%d]\n", w, h);
        goto DONE;
    }

    if (roi->number > VEPU541_MAX_ROI_NUM) {
        mpp_err_f("invalid region number %d\n", roi->number);
        goto DONE;
    }

    /* check region config */
    ret = MPP_OK;
    for (i = 0; i < (RK_S32)roi->number; i++, region++) {
        if (region->x + region->w > w || region->y + region->h > h)
            ret = MPP_NOK;

        if (region->intra > 1 || region->qp_area_idx >= VEPU541_MAX_ROI_NUM ||
            region->area_map_en > 1 || region->abs_qp_en > 1)
            ret = MPP_NOK;

        if ((region->abs_qp_en && region->quality > 51) ||
            (!region->abs_qp_en && (region->quality > 51 || region->quality < -51)))
            ret = MPP_NOK;

        if (ret) {
            mpp_err_f("region %d invalid param:\n", i);
            mpp_err_f("position [%d:%d:%d:%d] vs [%d:%d]\n",
                      region->x, region->y, region->w, region->h, w, h);
            mpp_err_f("force intra %d qp area index %d\n",
                      region->intra, region->qp_area_idx);
            mpp_err_f("abs qp mode %d value %d\n",
                      region->abs_qp_en, region->quality);
            goto DONE;
        }
    }

    region = roi->regions;
    /* step 2. setup region for top to bottom */
    for (i = 0; i < (RK_S32)roi->number; i++, region++) {
        vepu541_set_one_roi(buf, region, w, h);
    }

DONE:
    return ret;
}